

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_ObjSimRsb(Gia_SimRsbMan_t *p,int iObj,int nCands,int fVerbose,int *pnBufs,int *pnInvs)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  word *pwVar6;
  word *pwVar7;
  int i;
  int local_50;
  
  pVVar5 = Gia_SimRsbTfo(p,iObj,-1);
  pwVar6 = Gia_SimRsbCareSet(p,iObj,pVVar5);
  pwVar7 = Vec_WrdEntryP(p->vSimsObj,p->nWords * iObj);
  pVVar5 = Gia_ObjSimCands(p,iObj,nCands);
  Abc_TtAndSharp(p->pFunc[0],pwVar6,pwVar7,p->nWords,1);
  Abc_TtAndSharp(p->pFunc[1],pwVar6,pwVar7,p->nWords,0);
  local_50 = 0;
  for (i = 0; i < pVVar5->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(pVVar5,i);
    pwVar7 = Vec_WrdEntryP(p->vSimsObj,uVar1 * p->nWords);
    pwVar6 = p->pFunc[0];
    iVar4 = p->nWords;
    iVar2 = Abc_TtIntersect(pwVar7,pwVar6,iVar4,0);
    if (iVar2 == 0) {
      iVar4 = Abc_TtIntersect(pwVar7,p->pFunc[1],iVar4,1);
      if ((iVar4 == 0) && (*pnBufs = *pnBufs + 1, local_50 = 1, fVerbose != 0)) {
        uVar3 = Gia_ObjLevelId(p->pGia,iObj);
        printf("Level %3d : %d = buf(%d)\n",(ulong)uVar3,(ulong)(uint)iObj,(ulong)uVar1);
        pwVar6 = p->pFunc[0];
        local_50 = 1;
      }
    }
    iVar4 = p->nWords;
    iVar2 = Abc_TtIntersect(pwVar7,pwVar6,iVar4,1);
    if ((iVar2 == 0) && (iVar4 = Abc_TtIntersect(pwVar7,p->pFunc[1],iVar4,0), iVar4 == 0)) {
      *pnInvs = *pnInvs + 1;
      local_50 = 1;
      if (fVerbose != 0) {
        uVar1 = Gia_ObjLevelId(p->pGia,iObj);
        printf("Level %3d : %d = inv(%d)\n",(ulong)uVar1,(ulong)(uint)iObj);
        local_50 = 1;
      }
    }
  }
  return local_50;
}

Assistant:

int Gia_ObjSimRsb( Gia_SimRsbMan_t * p, int iObj, int nCands, int fVerbose, int * pnBufs, int * pnInvs )
{
    int i, iCand, RetValue = 0;
    Vec_Int_t * vTfo   = Gia_SimRsbTfo( p, iObj, -1 );
    word * pCareSet    = Gia_SimRsbCareSet( p, iObj, vTfo );
    word * pFunc       = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    Vec_Int_t * vCands = Gia_ObjSimCands( p, iObj, nCands );
    Abc_TtAndSharp( p->pFunc[0], pCareSet, pFunc, p->nWords, 1 );
    Abc_TtAndSharp( p->pFunc[1], pCareSet, pFunc, p->nWords, 0 );

/*
printf( "Considering node %d with %d candidates:\n", iObj, Vec_IntSize(vCands) );
Vec_IntPrint( vTfo );
Vec_IntPrint( vCands );
Extra_PrintBinary( stdout, (unsigned *)pCareSet,    64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)pFunc,       64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[0], 64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[1], 64 );  printf( "\n" );
*/
    Vec_IntForEachEntry( vCands, iCand, i )
    {
        word * pDiv = Vec_WrdEntryP( p->vSimsObj, p->nWords*iCand );
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 0) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 1) )
            { (*pnBufs)++; if ( fVerbose ) printf( "Level %3d : %d = buf(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 1) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 0) )
            { (*pnInvs)++; if ( fVerbose ) printf( "Level %3d : %d = inv(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
    }
    return RetValue;
}